

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSAXParseFile(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined8 uVar2;
  xmlParserCtxtPtr ctxt;
  xmlSAXHandlerPtr SAX;
  PyObject *pyobj_SAX;
  char *URI;
  PyObject *pPStack_20;
  int recover;
  PyObject *args_local;
  PyObject *self_local;
  
  SAX = (xmlSAXHandlerPtr)0x0;
  pPStack_20 = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"Osi:xmlSAXParseFile",&SAX,&pyobj_SAX,(long)&URI + 4);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else if (SAX == (xmlSAXHandlerPtr)&_Py_NoneStruct) {
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  else {
    _Py_INCREF((PyObject *)SAX);
    uVar2 = xmlNewSAXParserCtxt(&pythonSaxHandler,SAX);
    xmlCtxtReadFile(uVar2,pyobj_SAX,0,0);
    xmlFreeParserCtxt(uVar2);
    _Py_INCREF((PyObject *)&_Py_NoneStruct);
    self_local = (PyObject *)&_Py_NoneStruct;
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlSAXParseFile(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
    int recover;
    const char *URI;
    PyObject *pyobj_SAX = NULL;
    xmlSAXHandlerPtr SAX = NULL;
    xmlParserCtxtPtr ctxt;

    if (!PyArg_ParseTuple(args, (char *) "Osi:xmlSAXParseFile", &pyobj_SAX,
                          &URI, &recover))
        return (NULL);

    if (pyobj_SAX == Py_None) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    SAX = &pythonSaxHandler;
    Py_INCREF(pyobj_SAX);
    /* The reference is released in pythonEndDocument() */
    ctxt = xmlNewSAXParserCtxt(SAX, pyobj_SAX);
    xmlCtxtReadFile(ctxt, URI, NULL, 0);
    xmlFreeParserCtxt(ctxt);
    Py_INCREF(Py_None);
    return (Py_None);
}